

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic_simplification.cpp
# Opt level: O0

void __thiscall
duckdb::ArithmeticSimplificationRule::ArithmeticSimplificationRule
          (ArithmeticSimplificationRule *this,ExpressionRewriter *rewriter)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  pointer pFVar1;
  undefined8 *in_RDI;
  templated_unique_single_t op;
  ExpressionRewriter *in_stack_fffffffffffffd88;
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>_>
  *__n;
  Rule *in_stack_fffffffffffffd90;
  key_equal *in_stack_fffffffffffffd98;
  hasher *in_stack_fffffffffffffda0;
  size_type in_stack_fffffffffffffda8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdb0;
  iterator in_stack_fffffffffffffdb8;
  size_type in_stack_fffffffffffffdc0;
  allocator_type *in_stack_fffffffffffffdd0;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdf8;
  string *local_1f0;
  undefined8 local_128;
  string *local_120;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string *local_98;
  undefined8 local_90;
  
  Rule::Rule(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  *in_RDI = &PTR__ArithmeticSimplificationRule_03514488;
  make_uniq<duckdb::FunctionExpressionMatcher>();
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd90);
  make_uniq<duckdb::ConstantExpressionMatcher>();
  unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>::
  unique_ptr<duckdb::ConstantExpressionMatcher,std::default_delete<std::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>>>,void>
            ((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>_>
              *)in_stack_fffffffffffffd88);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ::push_back((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
               *)in_stack_fffffffffffffd90,(value_type *)in_stack_fffffffffffffd88);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
               *)0xcd86e4);
  unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>,_true>
                 *)0xcd86f1);
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd90);
  make_uniq<duckdb::ExpressionMatcher>();
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ::push_back((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
               *)in_stack_fffffffffffffd90,(value_type *)in_stack_fffffffffffffd88);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
               *)0xcd874f);
  pFVar1 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)in_stack_fffffffffffffd90);
  pFVar1->policy = SOME;
  local_128._3_1_ = 1;
  local_120 = local_118;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_118,"+",(allocator *)((long)&local_128 + 7));
  local_120 = local_f8;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_f8,"-",(allocator *)((long)&local_128 + 6));
  local_120 = local_d8;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_d8,anon_var_dwarf_3eb663c + 8,(allocator *)((long)&local_128 + 5));
  local_120 = local_b8;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_b8,"//",(allocator *)((long)&local_128 + 4));
  local_128._3_1_ = 0;
  local_98 = local_118;
  local_90 = 4;
  __n = (unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>_>
         *)&local_128;
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0xcd88e2);
  __l._M_len = in_stack_fffffffffffffdc0;
  __l._M_array = in_stack_fffffffffffffdb8;
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(in_stack_fffffffffffffdb0,__l,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                  in_stack_fffffffffffffd98,in_stack_fffffffffffffdd0);
  make_uniq<duckdb::ManyFunctionMatcher,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffdf8);
  unique_ptr<duckdb::FunctionMatcher,std::default_delete<duckdb::FunctionMatcher>,true>::
  unique_ptr<duckdb::ManyFunctionMatcher,std::default_delete<std::unique_ptr<duckdb::FunctionMatcher,std::default_delete<duckdb::FunctionMatcher>>>,void>
            ((unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>
              *)in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::ManyFunctionMatcher,_std::default_delete<duckdb::ManyFunctionMatcher>_>
              *)__n);
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd90);
  unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>::operator=
            ((unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>
              *)in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>
              *)__n);
  unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>,_true>
               *)0xcd898c);
  unique_ptr<duckdb::ManyFunctionMatcher,_std::default_delete<duckdb::ManyFunctionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ManyFunctionMatcher,_std::default_delete<duckdb::ManyFunctionMatcher>,_true>
               *)0xcd8999);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0xcd89a6);
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0xcd89b3);
  local_1f0 = (string *)&local_98;
  do {
    local_1f0 = local_1f0 + -0x20;
    ::std::__cxx11::string::~string(local_1f0);
  } while (local_1f0 != local_118);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&local_128 + 4));
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&local_128 + 5));
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&local_128 + 6));
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&local_128 + 7));
  make_uniq<duckdb::IntegerTypeMatcher>();
  unique_ptr<duckdb::TypeMatcher,std::default_delete<duckdb::TypeMatcher>,true>::
  unique_ptr<duckdb::IntegerTypeMatcher,std::default_delete<std::unique_ptr<duckdb::TypeMatcher,std::default_delete<duckdb::TypeMatcher>>>,void>
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>_>
              *)__n);
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd90);
  unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::operator=
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)__n)
  ;
  unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::~unique_ptr
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             0xcd8a92);
  unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>,_true>
               *)0xcd8a9f);
  make_uniq<duckdb::IntegerTypeMatcher>();
  unique_ptr<duckdb::TypeMatcher,std::default_delete<duckdb::TypeMatcher>,true>::
  unique_ptr<duckdb::IntegerTypeMatcher,std::default_delete<std::unique_ptr<duckdb::TypeMatcher,std::default_delete<duckdb::TypeMatcher>>>,void>
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>_>
              *)__n);
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd90);
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_true>
                *)in_stack_fffffffffffffd90,(size_type)__n);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  operator->((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)in_stack_fffffffffffffd90);
  unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::operator=
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)__n)
  ;
  unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::~unique_ptr
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             0xcd8b26);
  unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>,_true>
               *)0xcd8b33);
  make_uniq<duckdb::IntegerTypeMatcher>();
  unique_ptr<duckdb::TypeMatcher,std::default_delete<duckdb::TypeMatcher>,true>::
  unique_ptr<duckdb::IntegerTypeMatcher,std::default_delete<std::unique_ptr<duckdb::TypeMatcher,std::default_delete<duckdb::TypeMatcher>>>,void>
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>_>
              *)__n);
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
  ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                *)in_stack_fffffffffffffd90);
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_true>
                *)in_stack_fffffffffffffd90,(size_type)__n);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  operator->((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)in_stack_fffffffffffffd90);
  unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::operator=
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)__n)
  ;
  unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true>::~unique_ptr
            ((unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>,_true> *)
             0xcd8bb9);
  unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::IntegerTypeMatcher,_std::default_delete<duckdb::IntegerTypeMatcher>,_true>
               *)0xcd8bc6);
  unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>::
  unique_ptr<duckdb::FunctionExpressionMatcher,std::default_delete<std::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>>>,void>
            ((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)in_stack_fffffffffffffd90,__n);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  operator=((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
             *)in_stack_fffffffffffffd90,
            (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
             *)__n);
  unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
               *)0xcd8c01);
  unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
  ::~unique_ptr((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                 *)0xcd8c0e);
  return;
}

Assistant:

ArithmeticSimplificationRule::ArithmeticSimplificationRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// match on an OperatorExpression that has a ConstantExpression as child
	auto op = make_uniq<FunctionExpressionMatcher>();
	op->matchers.push_back(make_uniq<ConstantExpressionMatcher>());
	op->matchers.push_back(make_uniq<ExpressionMatcher>());
	op->policy = SetMatcher::Policy::SOME;
	// we only match on simple arithmetic expressions (+, -, *, /)
	op->function = make_uniq<ManyFunctionMatcher>(unordered_set<string> {"+", "-", "*", "//"});
	// and only with numeric results
	op->type = make_uniq<IntegerTypeMatcher>();
	op->matchers[0]->type = make_uniq<IntegerTypeMatcher>();
	op->matchers[1]->type = make_uniq<IntegerTypeMatcher>();
	root = std::move(op);
}